

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

bool __thiscall
Gluco::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Gluco::Lit> *out_clause)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  anon_struct_12_8_f15147c9_for_header *paVar4;
  undefined8 in_RAX;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  Clause *pCVar9;
  long lVar10;
  undefined8 local_38;
  
  this->merges = this->merges + 1;
  if (out_clause->data != (Lit *)0x0) {
    out_clause->sz = 0;
  }
  paVar4 = &_ps->header;
  pCVar9 = _qs;
  lVar5 = *(long *)&_qs->header;
  if ((int)((ulong)*(long *)paVar4 >> 0x20) < (int)((ulong)*(long *)&_qs->header >> 0x20)) {
    pCVar9 = _ps;
    _ps = _qs;
    lVar5 = *(long *)paVar4;
  }
  lVar8 = 0;
  local_38 = in_RAX;
  while( true ) {
    if (lVar5 >> 0x20 <= lVar8) break;
    uVar1 = *(uint *)(&pCVar9[1].header.field_0x0 + lVar8 * 4);
    if ((int)uVar1 >> 1 != v) {
      uVar2 = *(uint *)&(_ps->header).field_0x4;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar6 == uVar7) {
          local_38 = CONCAT44(uVar1,local_38._0_4_);
          vec<Gluco::Lit>::push(out_clause,(Lit *)((long)&local_38 + 4));
          lVar5 = *(long *)&pCVar9->header;
          goto LAB_004bfb0c;
        }
        uVar2 = *(uint *)(&_ps[1].header.field_0x0 + uVar7 * 4);
        uVar7 = uVar7 + 1;
      } while ((int)uVar2 >> 1 != (int)uVar1 >> 1);
      if ((uVar2 ^ uVar1) == 1) goto LAB_004bfb3e;
    }
LAB_004bfb0c:
    lVar8 = lVar8 + 1;
  }
  for (lVar10 = 0; lVar10 < *(int *)&(_ps->header).field_0x4; lVar10 = lVar10 + 1) {
    iVar3 = *(int *)(&_ps[1].header.field_0x0 + lVar10 * 4);
    if (iVar3 >> 1 != v) {
      local_38 = CONCAT44(local_38._4_4_,iVar3);
      vec<Gluco::Lit>::push(out_clause,(Lit *)&local_38);
    }
  }
LAB_004bfb3e:
  return lVar5 >> 0x20 <= lVar8;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    int i, j;
    for (i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i])) {
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
                }
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}